

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

void boost::filesystem::detail::directory_iterator_increment(directory_iterator *it,error_code *ec)

{
  int iVar1;
  element_type *peVar2;
  type pdVar3;
  type pdVar4;
  unspecified_bool_type p_Var5;
  path *this;
  filesystem_error *this_00;
  int *piVar6;
  error_category *peVar7;
  char *pcVar8;
  long lVar9;
  error_code eVar10;
  file_status local_108;
  file_status local_100;
  path local_f8;
  undefined4 local_d8;
  undefined1 local_d1;
  error_code local_d0;
  allocator<char> local_b9;
  string local_b8;
  undefined1 local_98 [8];
  path error_path;
  undefined4 uStack_64;
  undefined1 local_58 [8];
  error_code temp_ec;
  file_status symlink_file_stat;
  file_status file_stat;
  string_type filename;
  error_code *ec_local;
  directory_iterator *it_local;
  
  peVar2 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::get(&it->m_imp);
  if (peVar2 == (element_type *)0x0) {
    __assert_fail("(it.m_imp.get())&&(\"attempt to increment end iterator\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x8f5,
                  "void boost::filesystem::detail::directory_iterator_increment(directory_iterator &, system::error_code *)"
                 );
  }
  pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
  if (pdVar3->handle == (void *)0x0) {
    __assert_fail("(it.m_imp->handle != 0)&&(\"internal program error\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/operations.cpp"
                  ,0x8f6,
                  "void boost::filesystem::detail::directory_iterator_increment(directory_iterator &, system::error_code *)"
                 );
  }
  std::__cxx11::string::string((string *)&file_stat);
  file_status::file_status(&symlink_file_stat);
  file_status::file_status((file_status *)&temp_ec.m_cat);
  system::error_code::error_code((error_code *)local_58);
  do {
    pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    pdVar4 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    eVar10 = anon_unknown.dwarf_522f::dir_itr_increment
                       (&pdVar3->handle,&pdVar4->buffer,(string *)&file_stat,&symlink_file_stat,
                        (file_status *)&temp_ec.m_cat);
    temp_ec._0_8_ = eVar10.m_cat;
    local_58._4_4_ = uStack_64;
    local_58._0_4_ = eVar10.m_val;
    p_Var5 = system::error_code::operator_cast_to_function_pointer((error_code *)local_58);
    if (p_Var5 != (unspecified_bool_type)0x0) {
      pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
      this = directory_entry::path(&pdVar3->dir_entry);
      filesystem::path::parent_path((path *)local_98,this);
      shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
      if (ec == (error_code *)0x0) {
        local_d1 = 1;
        this_00 = (filesystem_error *)__cxa_allocate_exception(0x50);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"boost::filesystem::directory_iterator::operator++",&local_b9
                  );
        piVar6 = __errno_location();
        iVar1 = *piVar6;
        peVar7 = system::system_category();
        system::error_code::error_code(&local_d0,iVar1,peVar7);
        eVar10._4_4_ = 0;
        eVar10.m_val = local_d0.m_val;
        eVar10.m_cat = local_d0.m_cat;
        filesystem_error::filesystem_error(this_00,&local_b8,(path *)local_98,eVar10);
        local_d1 = 0;
        __cxa_throw(this_00,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
      }
      piVar6 = __errno_location();
      iVar1 = *piVar6;
      peVar7 = system::system_category();
      system::error_code::assign(ec,iVar1,peVar7);
      local_d8 = 1;
      filesystem::path::~path((path *)local_98);
      goto LAB_00116494;
    }
    if (ec != (error_code *)0x0) {
      system::error_code::clear(ec);
    }
    pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
    if (pdVar3->handle == (void *)0x0) {
      shared_ptr<boost::filesystem::detail::dir_itr_imp>::reset(&it->m_imp);
      local_d8 = 1;
      goto LAB_00116494;
    }
    pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&file_stat);
  } while ((*pcVar8 == '.') &&
          ((lVar9 = std::__cxx11::string::size(), lVar9 == 1 ||
           ((pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)&file_stat), *pcVar8 == '.' &&
            (lVar9 = std::__cxx11::string::size(), lVar9 == 2))))));
  pdVar3 = shared_ptr<boost::filesystem::detail::dir_itr_imp>::operator->(&it->m_imp);
  filesystem::path::path(&local_f8,(string_type *)&file_stat);
  file_status::file_status(&local_100,&symlink_file_stat);
  file_status::file_status(&local_108,(file_status *)&temp_ec.m_cat);
  directory_entry::replace_filename(&pdVar3->dir_entry,&local_f8,&local_100,&local_108);
  filesystem::path::~path(&local_f8);
  local_d8 = 1;
LAB_00116494:
  std::__cxx11::string::~string((string *)&file_stat);
  return;
}

Assistant:

void directory_iterator_increment(directory_iterator& it,
    system::error_code* ec)
  {
    BOOST_ASSERT_MSG(it.m_imp.get(), "attempt to increment end iterator");
    BOOST_ASSERT_MSG(it.m_imp->handle != 0, "internal program error");
    
    path::string_type filename;
    file_status file_stat, symlink_file_stat;
    system::error_code temp_ec;

    for (;;)
    {
      temp_ec = dir_itr_increment(it.m_imp->handle,
#       if defined(BOOST_POSIX_API)
        it.m_imp->buffer,
#       endif
        filename, file_stat, symlink_file_stat);

      if (temp_ec)  // happens if filesystem is corrupt, such as on a damaged optical disc
      {
        path error_path(it.m_imp->dir_entry.path().parent_path());  // fix ticket #5900
        it.m_imp.reset();
        if (ec == 0)
          BOOST_FILESYSTEM_THROW(
            filesystem_error("boost::filesystem::directory_iterator::operator++",
              error_path,
              error_code(BOOST_ERRNO, system_category())));
        ec->assign(BOOST_ERRNO, system_category());
        return;
      }
      else if (ec != 0) ec->clear();

      if (it.m_imp->handle == 0)  // eof, make end
      {
        it.m_imp.reset();
        return;
      }

      if (!(filename[0] == dot // !(dot or dot-dot)
        && (filename.size()== 1
          || (filename[1] == dot
            && filename.size()== 2))))
      {
        it.m_imp->dir_entry.replace_filename(
          filename, file_stat, symlink_file_stat);
        return;
      }
    }
  }